

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

P __thiscall ccs::ParserImpl::parseStep(ParserImpl *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ParserImpl *in_RSI;
  P PVar3;
  Key local_68;
  undefined1 local_19;
  ParserImpl *this_local;
  P *result;
  
  this_local = this;
  bVar1 = advanceIf(in_RSI,LPAREN);
  if (bVar1) {
    local_19 = 0;
    parseSum(this);
    expect(in_RSI,RPAREN);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    parseSingleStep(&local_68,in_RSI);
    ast::SelectorLeaf::step((SelectorLeaf *)this,&local_68);
    Key::~Key(&local_68);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (P)PVar3.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ast::SelectorLeaf::P parseStep() {
    if (advanceIf(Token::LPAREN)) {
      auto result = parseSum();
      expect(Token::RPAREN);
      return result;
    } else {
      return ast::SelectorLeaf::step(parseSingleStep());
    }
  }